

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Access_block_grid(int g_a,int *index,void *ptr,int *ld)

{
  Integer IVar1;
  long lVar2;
  Integer *ld_00;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer aIStack_a8 [8];
  Integer local_68 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      aIStack_a8[lVar2 + -1] = (long)*index;
      index = index + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  ld_00 = local_68;
  pnga_access_block_grid_ptr((long)g_a,aIStack_a8,ptr,ld_00);
  if (1 < IVar1) {
    do {
      ld[IVar1 + -2] = (int)*ld_00;
      IVar1 = IVar1 + -1;
      ld_00 = ld_00 + 1;
    } while (IVar1 != 1);
  }
  return;
}

Assistant:

void NGA_Access_block_grid(int g_a, int index[], void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     COPYC2F(index, _ga_lo, ndim);
     wnga_access_block_grid_ptr(a,_ga_lo,ptr,_ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}